

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O2

void soplex::
     SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start,bool type)

{
  IdxElement *pIVar1;
  IdxElement *pIVar2;
  IdxElement *pIVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  double dVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *pdVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  IdxElement tmp;
  
  if (end <= start + 1) {
    return;
  }
  iVar19 = end + -1;
LAB_001fead3:
  uVar10 = iVar19 - start;
  if ((int)uVar10 < 0x19) {
    if ((int)uVar10 < 1) {
      return;
    }
    SPxShellsort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
              (keys,iVar19,compare,start);
    return;
  }
  iVar11 = (uVar10 >> 1) + start;
  pIVar1 = keys + iVar11;
  dVar4 = keys[iVar11].val;
  lVar12 = (long)iVar19;
  lVar13 = (long)start;
  iVar11 = iVar19;
  iVar17 = start;
  do {
    lVar14 = (long)iVar17;
    iVar18 = iVar19;
    if (iVar19 < iVar17) {
      iVar18 = iVar17;
    }
    if ((type & 1U) == 0) {
      lVar16 = (long)iVar11;
      pdVar15 = &keys[lVar14].val;
      for (; lVar14 < lVar12; lVar14 = lVar14 + 1) {
        dVar5 = *pdVar15;
        if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (0.0 < dVar4 - dVar5)) {
          iVar18 = (int)lVar14;
          break;
        }
        pdVar15 = pdVar15 + 2;
      }
      if (start <= iVar11) {
        iVar11 = start;
      }
      pdVar15 = &keys[lVar16].val;
      for (; lVar13 < lVar16; lVar16 = lVar16 + -1) {
        if (dVar4 < *pdVar15 || dVar4 == *pdVar15) {
          iVar11 = (int)lVar16;
          break;
        }
        pdVar15 = pdVar15 + -2;
      }
    }
    else {
      pdVar15 = &keys[lVar14].val;
      for (; lVar14 < lVar12; lVar14 = lVar14 + 1) {
        if (*pdVar15 <= dVar4) {
          iVar18 = (int)lVar14;
          break;
        }
        pdVar15 = pdVar15 + 2;
      }
      lVar14 = (long)iVar11;
      if (start <= iVar11) {
        iVar11 = start;
      }
      pdVar15 = &keys[lVar14].val;
      for (; lVar13 < lVar14; lVar14 = lVar14 + -1) {
        dVar5 = *pdVar15;
        if (((dVar5 != dVar4) || (NAN(dVar5) || NAN(dVar4))) && (dVar4 - dVar5 < 0.0)) {
          iVar11 = (int)lVar14;
          break;
        }
        pdVar15 = pdVar15 + -2;
      }
    }
    if (iVar11 <= iVar18) break;
    pIVar2 = keys + iVar18;
    iVar17 = pIVar2->idx;
    uVar9 = *(undefined4 *)&pIVar2->field_0x4;
    dVar5 = pIVar2->val;
    pIVar2 = keys + iVar11;
    uVar8 = *(undefined4 *)&pIVar2->field_0x4;
    dVar7 = pIVar2->val;
    pIVar3 = keys + iVar18;
    pIVar3->idx = pIVar2->idx;
    *(undefined4 *)&pIVar3->field_0x4 = uVar8;
    pIVar3->val = dVar7;
    pIVar2 = keys + iVar11;
    pIVar2->idx = iVar17;
    *(undefined4 *)&pIVar2->field_0x4 = uVar9;
    pIVar2->val = dVar5;
    iVar17 = iVar18 + 1;
    iVar11 = iVar11 + -1;
  } while( true );
  if ((type & 1U) == 0) {
    lVar14 = (long)iVar11;
    if (start <= iVar11) {
      iVar11 = start;
    }
    pdVar15 = &keys[lVar14].val;
    for (; lVar13 < lVar14; lVar14 = lVar14 + -1) {
      dVar5 = *pdVar15;
      if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (0.0 < dVar5 - dVar4)) {
        iVar11 = (int)lVar14;
        break;
      }
      pdVar15 = pdVar15 + -2;
    }
    if (iVar11 == iVar19) {
      pIVar2 = keys + lVar12;
      iVar11 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar12;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar11;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      iVar11 = iVar19 + -1;
    }
  }
  else {
    lVar14 = (long)iVar18;
    if (iVar18 <= iVar19) {
      iVar18 = iVar19;
    }
    pdVar15 = &keys[lVar14].val;
    for (; lVar14 < lVar12; lVar14 = lVar14 + 1) {
      dVar5 = *pdVar15;
      if (((dVar4 != dVar5) || (NAN(dVar4) || NAN(dVar5))) && (dVar5 - dVar4 < 0.0)) {
        iVar18 = (int)lVar14;
        break;
      }
      pdVar15 = pdVar15 + 2;
    }
    if (iVar18 == start) {
      pIVar2 = keys + lVar13;
      iVar17 = pIVar2->idx;
      uVar9 = *(undefined4 *)&pIVar2->field_0x4;
      dVar4 = pIVar2->val;
      uVar8 = *(undefined4 *)&pIVar1->field_0x4;
      dVar5 = pIVar1->val;
      pIVar2 = keys + lVar13;
      pIVar2->idx = pIVar1->idx;
      *(undefined4 *)&pIVar2->field_0x4 = uVar8;
      pIVar2->val = dVar5;
      pIVar1->idx = iVar17;
      *(undefined4 *)&pIVar1->field_0x4 = uVar9;
      pIVar1->val = dVar4;
      iVar18 = start + 1;
    }
  }
  if (iVar19 - iVar18 < iVar11 - start) {
    bVar6 = iVar19 <= iVar18;
    iVar17 = iVar11;
    iVar11 = iVar19;
    iVar19 = iVar18;
    iVar18 = start;
    if (bVar6) goto LAB_001fed2d;
  }
  else {
    bVar6 = iVar11 <= start;
    iVar17 = iVar19;
    iVar19 = start;
    start = iVar18;
    if (bVar6) goto LAB_001fed2d;
  }
  SPxQuicksort<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
            (keys,iVar11 + 1,compare,iVar19,(bool)(~type & 1));
  start = iVar18;
LAB_001fed2d:
  iVar19 = iVar17;
  type = (bool)(type ^ 1);
  goto LAB_001fead3;
}

Assistant:

void SPxQuicksort(T* keys, int end, COMPARATOR& compare, int start = 0, bool type = true)
{
   assert(start >= 0);

   /* nothing to sort for less than two elements */
   if(end <= start + 1)
      return;

   /* reduce end position to last element index */
   --end;

   /* use quick-sort for long lists */
   while(end - start >= SOPLEX_SHELLSORTMAX)
   {
      T pivotkey;
      T tmp;
      int lo;
      int hi;
      int mid;

      /* select pivot element */
      mid = start + (end - start) / 2; // Instead of (start + end)/2 because the
      // latter can overflow if start + end >
      // INT_MAX
      pivotkey = keys[mid];

      /* partition the array into elements < pivot [start,hi] and elements >= pivot [lo,end] */
      lo = start;
      hi = end;

      for(;;)
      {
         if(type)
         {
            while(lo < end && compare(keys[lo], pivotkey) < 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) >= 0)
               hi--;
         }
         else
         {
            while(lo < end && compare(keys[lo], pivotkey) <= 0)
               lo++;

            while(hi > start && compare(keys[hi], pivotkey) > 0)
               hi--;
         }

         if(lo >= hi)
            break;

         tmp = keys[lo];
         keys[lo] = keys[hi];
         keys[hi] = tmp;

         lo++;
         hi--;
      }

      assert((hi == lo - 1) || (type && hi == start) || (!type && lo == end));

      /* skip entries which are equal to the pivot element (three partitions, <, =, > than pivot)*/
      if(type)
      {
         while(lo < end && compare(pivotkey, keys[lo]) >= 0)
            lo++;

         /* make sure that we have at least one element in the smaller partition */
         if(lo == start)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[lo];
            keys[lo] = keys[mid];
            keys[mid] = tmp;

            lo++;
         }
      }
      else
      {
         while(hi > start && compare(pivotkey, keys[hi]) <= 0)
            hi--;

         /* make sure that we have at least one element in the smaller partition */
         if(hi == end)
         {
            /* everything is greater or equal than the pivot element: move pivot to the left (degenerate case) */
            assert(compare(keys[mid], pivotkey) == 0); /* the pivot element did not change its position */

            tmp = keys[hi];
            keys[hi] = keys[mid];
            keys[mid] = tmp;

            hi--;
         }
      }

      /* sort the smaller partition by a recursive call, sort the larger part without recursion */
      if(hi - start <= end - lo)
      {
         /* sort [start,hi] with a recursive call */
         if(start < hi)
         {
            SPxQuicksort(keys, hi + 1, compare, start, !type);
         }

         /* now focus on the larger part [lo,end] */
         start = lo;
      }
      else
      {
         if(lo < end)
         {
            SPxQuicksort(keys, end + 1, compare, lo, !type);
         }

         /* now focus on the larger part [start,hi] */
         end = hi;
      }

      type = !type;
   }

   /* use shell sort on the remaining small list */
   if(end - start >= 1)
   {
      SPxShellsort(keys, end, compare, start);
   }


#ifdef CHECK_SORTING

   for(int i = start; i < end; ++i)
      assert(compare(keys[i], keys[i + 1]) <= 0);

#endif
}